

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O3

int __thiscall
helics::ipc::SendToQueue::connect(SendToQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  SendToQueue *pSVar6;
  char *pcVar7;
  size_type sVar8;
  int iVar9;
  queue_state_t qVar10;
  shared_memory_object *psVar11;
  int *piVar12;
  managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false> *__p_00;
  int iVar13;
  uint uVar14;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  size_type sVar16;
  pointer __p;
  uint uVar17;
  mapped_region local_100;
  SendToQueue *local_e0;
  shared_memory_object *local_d8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined4 local_ac;
  string stateName;
  char *local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  string *local_68;
  pointer local_60;
  timespec local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  _Alloc_hider _Var15;
  
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000034,__fd);
  local_ac = SUB84(__addr,0);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->connectionNameOrig,__str);
  pcVar2 = (__str->_M_dataplus)._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + __str->_M_string_length);
  sVar8 = local_80;
  pcVar7 = local_88;
  if (local_80 != 0) {
    sVar16 = 0;
    do {
      iVar13 = (int)pcVar7[sVar16];
      iVar9 = isalnum(iVar13);
      if ((iVar13 != 0x5f) && (iVar9 == 0)) {
        pcVar7[sVar16] = '_';
      }
      sVar16 = sVar16 + 1;
    } while (sVar8 != sVar16);
  }
  stateName._M_string_length = local_80;
  paVar1 = &stateName.field_2;
  stateName._M_dataplus._M_p = local_88;
  if (local_88 == &local_78) {
    stateName.field_2._8_8_ = uStack_70;
    stateName._M_dataplus._M_p = (pointer)paVar1;
  }
  stateName.field_2._M_allocated_capacity._1_7_ = uStack_77;
  stateName.field_2._M_local_buf[0] = local_78;
  local_80 = 0;
  local_78 = '\0';
  local_68 = &this->connectionName;
  local_88 = &local_78;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stateName._M_dataplus._M_p != paVar1) {
    operator_delete(stateName._M_dataplus._M_p,stateName.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  pcVar3 = (this->connectionName)._M_dataplus._M_p;
  stateName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stateName,pcVar3,pcVar3 + (this->connectionName)._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stateName,
             "_state");
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->errorString
  ;
  uVar17 = 0;
  bVar5 = false;
  local_e0 = this;
  do {
    _Var15._M_p = stateName._M_dataplus._M_p;
    psVar11 = (shared_memory_object *)operator_new(0x28);
    boost::interprocess::shared_memory_object::shared_memory_object(psVar11,_Var15._M_p,2);
    local_d8[0] = psVar11;
    boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
              (&local_100,psVar11,read_write,0,0,(void *)0x0,-1);
    qVar10 = SharedQueueState::getState((SharedQueueState *)local_100.m_base);
    psVar11 = local_d8[0];
    bVar4 = true;
    if ((uint)qVar10 < 2) {
      bVar5 = true;
    }
    else {
      if ((qVar10 == operating) && ((char)local_ac == '\0')) {
        bVar5 = true;
      }
      if (!bVar5) {
        uVar14 = uVar17 + 1;
        _Var15._M_p = (pointer)(ulong)uVar14;
        if ((int)uVar17 < (int)__len) {
          local_d8[0] = (shared_memory_object *)0x0;
          if (psVar11 != (shared_memory_object *)0x0) {
            std::default_delete<boost::interprocess::shared_memory_object>::operator()
                      ((default_delete<boost::interprocess::shared_memory_object> *)local_d8,psVar11
                      );
          }
          local_58.tv_sec = 0;
          local_58.tv_nsec = 200000000;
          do {
            iVar9 = nanosleep(&local_58,&local_58);
            uVar17 = uVar14;
            if (iVar9 != -1) break;
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
        }
        else {
          bVar4 = false;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(local_b8,0,(local_e0->errorString)._M_string_length,
                     "timed out waiting for the queue to become available",0x33);
          uVar17 = uVar14;
        }
      }
    }
    if ((SharedQueueState *)local_100.m_base != (SharedQueueState *)0x0) {
      if (local_100.m_is_xsi == true) {
        shmdt(local_100.m_base);
      }
      else {
        munmap((void *)((long)local_100.m_base - local_100.m_page_offset),
               local_100.m_page_offset + local_100.m_size);
      }
    }
    if (local_d8[0] != (shared_memory_object *)0x0) {
      std::default_delete<boost::interprocess::shared_memory_object>::operator()
                ((default_delete<boost::interprocess::shared_memory_object> *)local_d8,local_d8[0]);
    }
    if (!bVar4) {
      iVar9 = 0;
      goto LAB_0016df6b;
    }
    if (bVar5) {
      iVar9 = (int)CONCAT71((int7)((ulong)_Var15._M_p >> 8),1);
      if (local_e0->connected == false) {
        pcVar3 = (local_68->_M_dataplus)._M_p;
        __p_00 = (managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>
                  *)operator_new(0x20);
        local_48 = 0;
        uStack_40 = 0;
        local_60 = pcVar3;
        boost::interprocess::ipcdetail::
        managed_open_or_create_impl<boost::interprocess::shared_memory_object,0ul,true,false>::
        managed_open_or_create_impl<boost::interprocess::ipcdetail::msg_queue_initialization_func_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>>
                  (__p_00,&local_60,2,0,&local_48);
        pSVar6 = local_e0;
        local_100.m_base = (SharedQueueState *)0x0;
        std::
        __uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
        ::reset((__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                 *)local_e0,(pointer)__p_00);
        std::
        unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
        ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                       *)&local_100);
        pSVar6->connected = true;
      }
LAB_0016df6b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)stateName._M_dataplus._M_p != &stateName.field_2) {
        operator_delete(stateName._M_dataplus._M_p,stateName.field_2._M_allocated_capacity + 1);
      }
      return iVar9;
    }
  } while( true );
}

Assistant:

bool SendToQueue::connect(const std::string& connection, bool initOnly, int retries)
    {
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        std::string stateName = connectionName + "_state";
        bool goodToConnect = false;
        int tries = 0;
        while (!goodToConnect) {
            try {
                auto queue_state = std::make_unique<ipc_state>(boostipc::open_only,
                                                               stateName.c_str(),
                                                               boostipc::read_write);
                boostipc::mapped_region region(*queue_state, boostipc::read_write);

                auto* sstate = reinterpret_cast<SharedQueueState*>(region.get_address());

                switch (sstate->getState()) {
                    case queue_state_t::connected:
                    case queue_state_t::startup:
                        goodToConnect = true;
                        break;
                    case queue_state_t::operating:
                        if (!initOnly) {
                            goodToConnect = true;
                        }
                        break;
                    case queue_state_t::unknown:  // probably still undergoing setup
                    default:
                        break;
                }
                if (!goodToConnect) {
                    ++tries;
                    if (tries <= retries) {
                        queue_state.reset();
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    } else {
                        errorString = "timed out waiting for the queue to become available";
                        return false;
                    }
                }
            }

            catch (boost::interprocess::interprocess_exception const&) {
                // this likely means the shared_memory_object doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = "timed out waiting for the queue to become available";
                    return false;
                }
            }
        }

        while (!connected) {
            try {
                txqueue = std::make_unique<ipc_queue>(boostipc::open_only, connectionName.c_str());
                connected = true;
            }
            catch (boost::interprocess::interprocess_exception const& ipe) {
                // this likely means the shared file doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = std::string("Unable to open connection:") + ipe.what();
                    break;
                }
            }
        }
        return connected;
    }